

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O2

void cdns_debug_dump(void)

{
  char *pcVar1;
  long lVar2;
  int i;
  ulong uVar3;
  char buf [55];
  
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3c0,
             "cdns_debug_dump",0,6,"Dumping data for DNS servers:");
  lVar2 = 0xa4;
  for (uVar3 = 0; uVar3 < g_svr_count; uVar3 = uVar3 + 1) {
    pcVar1 = fmt_sockaddr_port((sockaddr *)((long)g_svr_cfg + lVar2 + -0x94),buf,0x37);
    _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3c8,
               "cdns_debug_dump",0,6,"DNS %s: rsp/req: %u/%u avg rtt: %ums",pcVar1,
               (ulong)*(uint *)((g_svr_cfg->addr).__ss_padding + lVar2 + -0x1a),
               (ulong)*(uint *)((g_svr_cfg->addr).__ss_padding + lVar2 + -0x1e),
               (ulong)*(uint *)((g_svr_cfg->addr).__ss_padding + lVar2 + -0x12));
    lVar2 = lVar2 + 0xe8;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3ca,
             "cdns_debug_dump",0,6,"End of data dumping.");
  return;
}

Assistant:

void cdns_debug_dump()
{
    char buf[INET_ADDR_PORT_STRLEN];

    log_error(LOG_INFO, "Dumping data for DNS servers:");

    for (int i = 0; i < g_svr_count; i++) {
        log_error(LOG_INFO, "DNS %s: rsp/req: %u/%u avg rtt: %ums",
                            fmt_sockaddr_port((struct sockaddr *)&g_svr_cfg[i].addr,
                                              &buf[0], sizeof(buf)),
                            g_svr_cfg[i].stats.n_rsp,
                            g_svr_cfg[i].stats.n_req,
                            g_svr_cfg[i].stats.avg_rtt);
    }
    log_error(LOG_INFO, "End of data dumping.");

}